

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.h
# Opt level: O1

bool __thiscall
basisu::etc_block::get_block_colors
          (etc_block *this,color_rgba *pBlock_colors,uint32_t subblock_index)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  byte bVar11;
  uint8_t uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint8_t uVar19;
  ushort packed_color5;
  uint uVar20;
  uint8_t uVar21;
  uint8_t uVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  undefined1 in_XMM2 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  color_rgba b;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_44 [5];
  
  bVar7 = (this->field_0).m_bytes[0];
  if (((this->field_0).m_bytes[3] & 2) == 0) {
    if (subblock_index == 0) {
      bVar7 = bVar7 >> 4;
      bVar9 = (this->field_0).m_bytes[1] >> 4;
      bVar11 = (this->field_0).m_bytes[2] >> 4;
    }
    else {
      bVar7 = bVar7 & 0xf;
      bVar9 = (this->field_0).m_bytes[1] & 0xf;
      bVar11 = (this->field_0).m_bytes[2] & 0xf;
    }
    local_44[0].field_1 =
         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
         unpack_color4(CONCAT11(bVar7,bVar9 << 4 | bVar11),true,0xff);
  }
  else {
    packed_color5 =
         (bVar7 & 0xf8) << 7 |
         (ushort)((this->field_0).m_bytes[2] >> 3) + ((this->field_0).m_bytes[1] & 0xfff8) * 4;
    if (subblock_index == 0) {
      unpack_color5((color_rgba *)&local_44[0].field_1,packed_color5,true);
    }
    else {
      unpack_color5((color_rgba *)&local_44[0].field_1,packed_color5,
                    (bVar7 & 7) << 6 |
                    ((this->field_0).m_bytes[2] & 7) + ((this->field_0).m_bytes[1] & 7) * 8,true,
                    0xff);
    }
  }
  if (subblock_index < 2) {
    uVar25 = (ulong)(((this->field_0).m_bytes[3] >> (subblock_index == 0) * '\x03' + 2 & 7) << 4);
    uVar23 = (uint)local_44[0] & 0xff;
    iVar2 = *(int *)(g_etc1_inten_tables + uVar25);
    uVar1 = iVar2 + uVar23;
    uVar13 = 0xff;
    if ((int)uVar1 < 0xff) {
      uVar13 = uVar1;
    }
    uVar22 = '\0';
    uVar12 = (uint8_t)uVar13;
    if ((int)uVar13 < 1) {
      uVar12 = uVar22;
    }
    uVar27 = (uint)local_44[0] >> 8 & 0xff;
    uVar13 = iVar2 + uVar27;
    uVar20 = 0xff;
    if ((int)uVar13 < 0xff) {
      uVar20 = uVar13;
    }
    uVar19 = (uint8_t)uVar20;
    if ((int)uVar20 < 1) {
      uVar19 = uVar22;
    }
    uVar18 = (uint)local_44[0] >> 0x10 & 0xff;
    uVar8 = iVar2 + uVar18;
    uVar20 = 0xff;
    if ((int)uVar8 < 0xff) {
      uVar20 = uVar8;
    }
    uVar21 = (uint8_t)uVar20;
    if ((int)uVar20 < 1) {
      uVar21 = uVar22;
    }
    iVar2 = *(int *)(g_etc1_inten_tables + uVar25 + 4);
    (pBlock_colors->field_0).m_comps[0] = uVar12;
    (pBlock_colors->field_0).m_comps[1] = uVar19;
    (pBlock_colors->field_0).m_comps[2] = uVar21;
    uVar20 = iVar2 + uVar23;
    uVar14 = 0xff;
    if ((int)uVar20 < 0xff) {
      uVar14 = uVar20;
    }
    uVar12 = (uint8_t)uVar14;
    if ((int)uVar14 < 1) {
      uVar12 = uVar22;
    }
    (pBlock_colors->field_0).m_comps[3] = 0xff;
    pBlock_colors[1].field_0.m_comps[0] = uVar12;
    pBlock_colors[1].field_0.m_comps[3] = 0xff;
    uVar14 = iVar2 + uVar27;
    uVar15 = 0xff;
    if ((int)uVar14 < 0xff) {
      uVar15 = uVar14;
    }
    uVar12 = (uint8_t)uVar15;
    if ((int)uVar15 < 1) {
      uVar12 = uVar22;
    }
    uVar26 = iVar2 + uVar18;
    uVar15 = 0xff;
    if ((int)uVar26 < 0xff) {
      uVar15 = uVar26;
    }
    pBlock_colors[2].field_0.m_comps[3] = 0xff;
    uVar19 = (uint8_t)uVar15;
    if ((int)uVar15 < 1) {
      uVar19 = uVar22;
    }
    pBlock_colors[1].field_0.m_comps[1] = uVar12;
    pBlock_colors[1].field_0.m_comps[2] = uVar19;
    iVar2 = *(int *)(g_etc1_inten_tables + uVar25 + 8);
    uVar15 = iVar2 + uVar23;
    uVar28 = 0xff;
    if ((int)uVar15 < 0xff) {
      uVar28 = uVar15;
    }
    uVar12 = (uint8_t)uVar28;
    if ((int)uVar28 < 1) {
      uVar12 = uVar22;
    }
    uVar28 = iVar2 + uVar27;
    uVar17 = 0xff;
    if ((int)uVar28 < 0xff) {
      uVar17 = uVar28;
    }
    uVar19 = (uint8_t)uVar17;
    if ((int)uVar17 < 1) {
      uVar19 = uVar22;
    }
    uVar16 = iVar2 + uVar18;
    uVar17 = 0xff;
    if ((int)uVar16 < 0xff) {
      uVar17 = uVar16;
    }
    pBlock_colors[2].field_0.m_comps[0] = uVar12;
    uVar12 = (uint8_t)uVar17;
    if ((int)uVar17 < 1) {
      uVar12 = uVar22;
    }
    pBlock_colors[2].field_0.m_comps[1] = uVar19;
    pBlock_colors[2].field_0.m_comps[2] = uVar12;
    iVar2 = *(int *)(g_etc1_inten_tables + uVar25 + 0xc);
    uVar23 = uVar23 + iVar2;
    uVar17 = 0xff;
    if ((int)uVar23 < 0xff) {
      uVar17 = uVar23;
    }
    if ((int)uVar17 < 1) {
      uVar17 = 0;
    }
    uVar27 = uVar27 + iVar2;
    uVar24 = 0xff;
    if ((int)uVar27 < 0xff) {
      uVar24 = uVar27;
    }
    if ((int)uVar24 < 1) {
      uVar24 = 0;
    }
    uVar18 = iVar2 + uVar18;
    uVar10 = 0xff;
    if ((int)uVar18 < 0xff) {
      uVar10 = uVar18;
    }
    auVar29 = pmovsxwd(in_XMM2,0x100010001000100);
    uVar3 = auVar29._0_4_;
    uVar4 = auVar29._4_4_;
    uVar5 = auVar29._8_4_;
    uVar6 = auVar29._12_4_;
    auVar30._0_4_ = -(uint)(((uVar28 < uVar3) * uVar3 | (uVar28 >= uVar3) * uVar28) == uVar28);
    auVar30._4_4_ = -(uint)(((uVar15 < uVar4) * uVar4 | (uVar15 >= uVar4) * uVar15) == uVar15);
    auVar30._8_4_ = -(uint)(((uVar26 < uVar5) * uVar5 | (uVar26 >= uVar5) * uVar26) == uVar26);
    auVar30._12_4_ = -(uint)(((uVar14 < uVar6) * uVar6 | (uVar14 >= uVar6) * uVar14) == uVar14);
    auVar29._0_4_ = -(uint)(((uVar3 < uVar18) * uVar18 | (uVar3 >= uVar18) * uVar3) == uVar18);
    auVar29._4_4_ = -(uint)(((uVar4 < uVar27) * uVar27 | (uVar4 >= uVar27) * uVar4) == uVar27);
    auVar29._8_4_ = -(uint)(((uVar5 < uVar23) * uVar23 | (uVar5 >= uVar23) * uVar5) == uVar23);
    auVar29._12_4_ = -(uint)(((uVar6 < uVar16) * uVar16 | (uVar6 >= uVar16) * uVar6) == uVar16);
    auVar29 = packssdw(auVar29,auVar30);
    uVar12 = (uint8_t)uVar10;
    if ((int)uVar10 < 1) {
      uVar12 = '\0';
    }
    pBlock_colors[3].field_0.m_comps[0] = (uint8_t)uVar17;
    pBlock_colors[3].field_0.m_comps[1] = (uint8_t)uVar24;
    pBlock_colors[3].field_0.m_comps[2] = uVar12;
    pBlock_colors[3].field_0.m_comps[3] = 0xff;
    return (0xff < (uVar8 | uVar20 | uVar13) || 0xff < uVar1) ||
           ((((((((((((((((auVar29 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar29 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar29 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar29 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar29 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar29 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar29 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar29 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar29 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar29 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar29[0xf] < '\0');
  }
  __assert_fail("subblock_id < 2",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                ,0xb8,"uint32_t basisu::etc_block::get_inten_table(uint32_t) const");
}

Assistant:

bool get_block_colors(color_rgba* pBlock_colors, uint32_t subblock_index) const
		{
			color_rgba b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), true);
				else
					unpack_color5(b, get_base5_color(), true);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), true);
			}

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(subblock_index)];

			bool dc = false;

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0], dc), clamp255(b.g + pInten_table[0], dc), clamp255(b.b + pInten_table[0], dc), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1], dc), clamp255(b.g + pInten_table[1], dc), clamp255(b.b + pInten_table[1], dc), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2], dc), clamp255(b.g + pInten_table[2], dc), clamp255(b.b + pInten_table[2], dc), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3], dc), clamp255(b.g + pInten_table[3], dc), clamp255(b.b + pInten_table[3], dc), 255);

			return dc;
		}